

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase *
EvaluateFunctionContextAccess(ExpressionEvalContext *ctx,ExprFunctionContextAccess *expression)

{
  bool bVar1;
  StackFrame **ppSVar2;
  ExprBase *this;
  ExprPointerLiteral *target;
  TypeRef *pTVar3;
  TypeClass *pTVar4;
  TypeClass *classType;
  TypeRef *refType;
  ExprBase *value;
  ExprPointerLiteral *ptr;
  ExprFunctionContextAccess *expression_local;
  ExpressionEvalContext *ctx_local;
  
  bVar1 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::empty(&ctx->stackFrames);
  if ((!bVar1) &&
     (ppSVar2 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames),
     (*ppSVar2)->targetYield != 0)) {
    this = &ExpressionContext::get<ExprVoid>(ctx->ctx)->super_ExprBase;
    ExprVoid::ExprVoid((ExprVoid *)this,(expression->super_ExprBase).source,ctx->ctx->typeVoid);
    return this;
  }
  bVar1 = AddInstruction(ctx);
  if (bVar1) {
    target = FindVariableStorage(ctx,expression->contextVariable,false);
    if (target == (ExprPointerLiteral *)0x0) {
      ctx_local = (ExpressionEvalContext *)0x0;
    }
    else {
      pTVar3 = getType<TypeRef>(expression->function->contextType);
      if (pTVar3 == (TypeRef *)0x0) {
        __assert_fail("refType",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x766,
                      "ExprBase *EvaluateFunctionContextAccess(ExpressionEvalContext &, ExprFunctionContextAccess *)"
                     );
      }
      pTVar4 = getType<TypeClass>(pTVar3->subType);
      if (pTVar4 == (TypeClass *)0x0) {
        __assert_fail("classType",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x76a,
                      "ExprBase *EvaluateFunctionContextAccess(ExpressionEvalContext &, ExprFunctionContextAccess *)"
                     );
      }
      bVar1 = IntrusiveList<MemberHandle>::empty(&(pTVar4->super_TypeStruct).members);
      if (bVar1) {
        refType = (TypeRef *)ExpressionContext::get<ExprNullptrLiteral>(ctx->ctx);
        ExprNullptrLiteral::ExprNullptrLiteral
                  ((ExprNullptrLiteral *)refType,(expression->super_ExprBase).source,
                   expression->function->contextType);
      }
      else {
        refType = (TypeRef *)CreateLoad(ctx,&target->super_ExprBase);
      }
      if (refType == (TypeRef *)0x0) {
        ctx_local = (ExpressionEvalContext *)0x0;
      }
      else {
        ctx_local = (ExpressionEvalContext *)
                    CheckType(&expression->super_ExprBase,(ExprBase *)refType);
      }
    }
  }
  else {
    ctx_local = (ExpressionEvalContext *)0x0;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* EvaluateFunctionContextAccess(ExpressionEvalContext &ctx, ExprFunctionContextAccess *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprPointerLiteral *ptr = FindVariableStorage(ctx, expression->contextVariable, false);

	if(!ptr)
		return NULL;

	ExprBase *value = NULL;

	TypeRef *refType = getType<TypeRef>(expression->function->contextType);

	assert(refType);

	TypeClass *classType = getType<TypeClass>(refType->subType);

	assert(classType);

	if(classType->members.empty())
		value = new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, expression->function->contextType);
	else
		value = CreateLoad(ctx, ptr);

	if(!value)
		return NULL;

	return CheckType(expression, value);
}